

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rlogin.c
# Opt level: O2

void rlogin_startup(Rlogin *rlogin,SeatPromptResult spr,char *ruser)

{
  Socket *pSVar1;
  SocketVtable *pSVar2;
  SeatPromptResult spr_00;
  char *pcVar3;
  size_t sVar4;
  size_t sVar5;
  undefined8 unaff_RBX;
  undefined8 unaff_R12;
  undefined8 unaff_R13;
  undefined8 unaff_R14;
  char z;
  
  z = '\0';
  pSVar1 = rlogin->s;
  pSVar2 = pSVar1->vt;
  if (spr.kind == SPRK_SW_ABORT) {
    (*pSVar2->close)(pSVar1);
    rlogin->s = (Socket *)0x0;
    spr_00.errfn = (_func_void_SeatPromptResult_BinarySink_ptr *)unaff_R12;
    spr_00._0_8_ = unaff_RBX;
    spr_00.errdata_lit = (char *)unaff_R13;
    spr_00._24_8_ = unaff_R14;
    pcVar3 = spr_get_error_message(spr_00);
    seat_connection_fatal(rlogin->seat,"%s",pcVar3);
    safefree(pcVar3);
  }
  else if (spr.kind == SPRK_USER_ABORT) {
    (*pSVar2->close)(pSVar1);
    rlogin->s = (Socket *)0x0;
    (*rlogin->seat->vt->notify_remote_exit)(rlogin->seat);
  }
  else {
    (*pSVar2->write)(pSVar1,&z,1);
    pcVar3 = conf_get_str(rlogin->conf,0x3b);
    pSVar1 = rlogin->s;
    sVar4 = strlen(pcVar3);
    (*pSVar1->vt->write)(pSVar1,pcVar3,sVar4);
    (*rlogin->s->vt->write)(rlogin->s,&z,1);
    pSVar1 = rlogin->s;
    sVar4 = strlen(ruser);
    (*pSVar1->vt->write)(pSVar1,ruser,sVar4);
    (*rlogin->s->vt->write)(rlogin->s,&z,1);
    pcVar3 = conf_get_str(rlogin->conf,0x35);
    pSVar1 = rlogin->s;
    sVar4 = strlen(pcVar3);
    (*pSVar1->vt->write)(pSVar1,pcVar3,sVar4);
    (*rlogin->s->vt->write)(rlogin->s,"/",1);
    pcVar3 = conf_get_str(rlogin->conf,0x36);
    pSVar1 = rlogin->s;
    sVar4 = strspn(pcVar3,"0123456789");
    (*pSVar1->vt->write)(pSVar1,pcVar3,sVar4);
    sVar5 = (*rlogin->s->vt->write)(rlogin->s,&z,1);
    rlogin->bufsize = (int)sVar5;
  }
  rlogin->prompt = (prompts_t *)0x0;
  if (rlogin->ldisc != (Ldisc *)0x0) {
    ldisc_check_sendok(rlogin->ldisc);
  }
  return;
}

Assistant:

static void rlogin_startup(Rlogin *rlogin, SeatPromptResult spr,
                           const char *ruser)
{
    char z = 0;
    char *p;

    if (spr.kind == SPRK_USER_ABORT) {
        /* User aborted at the username prompt. */
        sk_close(rlogin->s);
        rlogin->s = NULL;
        seat_notify_remote_exit(rlogin->seat);
    } else if (spr.kind == SPRK_SW_ABORT) {
        /* Something else went wrong at the username prompt, so we
         * have to show some kind of error. */
        sk_close(rlogin->s);
        rlogin->s = NULL;
        char *err = spr_get_error_message(spr);
        seat_connection_fatal(rlogin->seat, "%s", err);
        sfree(err);
    } else {
        sk_write(rlogin->s, &z, 1);
        p = conf_get_str(rlogin->conf, CONF_localusername);
        sk_write(rlogin->s, p, strlen(p));
        sk_write(rlogin->s, &z, 1);
        sk_write(rlogin->s, ruser, strlen(ruser));
        sk_write(rlogin->s, &z, 1);
        p = conf_get_str(rlogin->conf, CONF_termtype);
        sk_write(rlogin->s, p, strlen(p));
        sk_write(rlogin->s, "/", 1);
        p = conf_get_str(rlogin->conf, CONF_termspeed);
        sk_write(rlogin->s, p, strspn(p, "0123456789"));
        rlogin->bufsize = sk_write(rlogin->s, &z, 1);
    }

    rlogin->prompt = NULL;
    if (rlogin->ldisc)
        ldisc_check_sendok(rlogin->ldisc);
}